

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix_func.c
# Opt level: O0

void xc_mix_func(xc_func_type *func,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                double *zk,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
                double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
                double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,
                double *v2tau2,double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,
                double *v3rho2tau,double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,
                double *v3rholapl2,double *v3rholapltau,double *v3rhotau2,double *v3sigma3,
                double *v3sigma2lapl,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau
                ,double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
                double *v3tau3,double *v4rho4,double *v4rho3sigma,double *v4rho3lapl,
                double *v4rho3tau,double *v4rho2sigma2,double *v4rho2sigmalapl,
                double *v4rho2sigmatau,double *v4rho2lapl2,double *v4rho2lapltau,double *v4rho2tau2,
                double *v4rhosigma3,double *v4rhosigma2lapl,double *v4rhosigma2tau,
                double *v4rhosigmalapl2,double *v4rhosigmalapltau,double *v4rhosigmatau2,
                double *v4rholapl3,double *v4rholapl2tau,double *v4rholapltau2,double *v4rhotau3,
                double *v4sigma4,double *v4sigma3lapl,double *v4sigma3tau,double *v4sigma2lapl2,
                double *v4sigma2lapltau,double *v4sigma2tau2,double *v4sigmalapl3,
                double *v4sigmalapl2tau,double *v4sigmalapltau2,double *v4sigmatau3,double *v4lapl4,
                double *v4lapl3tau,double *v4lapl2tau2,double *v4lapltau3,double *v4tau4)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  double *in_stack_00000048;
  double *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  double *in_stack_00000068;
  double *in_stack_00000070;
  double *in_stack_00000078;
  long in_stack_00000080;
  long in_stack_00000120;
  int need_tau;
  int need_laplacian;
  int have_lxc;
  int have_kxc;
  int have_fxc;
  int have_vxc;
  xc_dimensions *dim;
  int ii;
  double *xv4tau4;
  double *xv4lapltau3;
  double *xv4lapl2tau2;
  double *xv4lapl3tau;
  double *xv4lapl4;
  double *xv4sigmatau3;
  double *xv4sigmalapltau2;
  double *xv4sigmalapl2tau;
  double *xv4sigmalapl3;
  double *xv4sigma2tau2;
  double *xv4sigma2lapltau;
  double *xv4sigma2lapl2;
  double *xv4sigma3tau;
  double *xv4sigma3lapl;
  double *xv4sigma4;
  double *xv4rhotau3;
  double *xv4rholapltau2;
  double *xv4rholapl2tau;
  double *xv4rholapl3;
  double *xv4rhosigmatau2;
  double *xv4rhosigmalapltau;
  double *xv4rhosigmalapl2;
  double *xv4rhosigma2tau;
  double *xv4rhosigma2lapl;
  double *xv4rhosigma3;
  double *xv4rho2tau2;
  double *xv4rho2lapltau;
  double *xv4rho2lapl2;
  double *xv4rho2sigmatau;
  double *xv4rho2sigmalapl;
  double *xv4rho2sigma2;
  double *xv4rho3tau;
  double *xv4rho3lapl;
  double *xv4rho3sigma;
  double *xv4rho4;
  double *xv3tau3;
  double *xv3lapltau2;
  double *xv3lapl2tau;
  double *xv3lapl3;
  double *xv3sigmatau2;
  double *xv3sigmalapltau;
  double *xv3sigmalapl2;
  double *xv3sigma2tau;
  double *xv3sigma2lapl;
  double *xv3sigma3;
  double *xv3rhotau2;
  double *xv3rholapltau;
  double *xv3rholapl2;
  double *xv3rhosigmatau;
  double *xv3rhosigmalapl;
  double *xv3rhosigma2;
  double *xv3rho2tau;
  double *xv3rho2lapl;
  double *xv3rho2sigma;
  double *xv3rho3;
  double *xv2tau2;
  double *xv2lapltau;
  double *xv2lapl2;
  double *xv2sigmatau;
  double *xv2sigmalapl;
  double *xv2sigma2;
  double *xv2rhotau;
  double *xv2rholapl;
  double *xv2rhosigma;
  double *xv2rho2;
  double *xvtau;
  double *xvlapl;
  double *xvsigma;
  double *xvrho;
  double *xzk;
  xc_func_type *aux;
  undefined8 in_stack_fffffffffffff528;
  undefined8 in_stack_fffffffffffff530;
  undefined1 v2rho2_00 [8];
  char **zk_00;
  char **vrho_00;
  undefined1 vsigma_00 [8];
  func_reference_type *vlapl_00;
  xc_func_type *p;
  func_reference_type *v2rhosigma_00;
  func_reference_type *v2rholapl_00;
  func_reference_type **v2sigma2_00;
  xc_func_type **v2sigmalapl_00;
  func_reference_type ***v2sigmatau_00;
  undefined1 v2lapl2_00 [8];
  func_reference_type ****v2lapltau_00;
  xc_func_type *p_00;
  xc_func_type **v3rho2sigma_00;
  double **v3rho2lapl_00;
  char **v3rho2tau_00;
  double ***v3rhosigma2_00;
  xc_func_type ***v3rhosigmalapl_00;
  double ****v3rhosigmatau_00;
  xc_func_type ****v3rholapl2_00;
  double *****v3rholapltau_00;
  xc_func_type *****v3rhotau2_00;
  double ******v3sigma3_00;
  xc_func_type ******v3sigma2lapl_00;
  double *******v3sigma2tau_00;
  char **v3sigmalapl2_00;
  double **v4sigma3tau_00;
  double **v4sigma2lapl2_00;
  double ***v4sigma2lapltau_00;
  double ***v4sigma2tau2_00;
  double ****v4sigmalapl3_00;
  double ****v4sigmalapl2tau_00;
  double *****v4sigmalapltau2_00;
  double **in_stack_fffffffffffff768;
  double **in_stack_fffffffffffff770;
  double **in_stack_fffffffffffff778;
  double **in_stack_fffffffffffff780;
  double **in_stack_fffffffffffff788;
  xc_func_type *in_stack_fffffffffffff790;
  double *in_stack_fffffffffffff7a0;
  double *in_stack_fffffffffffff7a8;
  double *in_stack_fffffffffffff7b0;
  double *in_stack_fffffffffffff7b8;
  double *in_stack_fffffffffffff7c0;
  double *in_stack_fffffffffffff7c8;
  double *in_stack_fffffffffffff7d0;
  double *in_stack_fffffffffffff7d8;
  double *in_stack_fffffffffffff7e0;
  double *in_stack_fffffffffffff7e8;
  double *in_stack_fffffffffffff7f0;
  double *in_stack_fffffffffffff7f8;
  double *in_stack_fffffffffffff800;
  double *in_stack_fffffffffffff808;
  double *in_stack_fffffffffffff810;
  double *in_stack_fffffffffffff818;
  double *in_stack_fffffffffffff820;
  double *in_stack_fffffffffffff828;
  double *in_stack_fffffffffffff830;
  double *in_stack_fffffffffffff838;
  double *in_stack_fffffffffffff840;
  double *in_stack_fffffffffffff848;
  double *in_stack_fffffffffffff850;
  double *in_stack_fffffffffffff858;
  double *in_stack_fffffffffffff860;
  double *in_stack_fffffffffffff868;
  double *in_stack_fffffffffffff870;
  double *in_stack_fffffffffffff878;
  double *in_stack_fffffffffffff880;
  double *in_stack_fffffffffffff888;
  double *in_stack_fffffffffffff890;
  double *in_stack_fffffffffffff898;
  double *in_stack_fffffffffffff8a0;
  double *in_stack_fffffffffffff8a8;
  double *in_stack_fffffffffffff8b0;
  double *in_stack_fffffffffffff8b8;
  double *in_stack_fffffffffffff8c0;
  double *in_stack_fffffffffffff8c8;
  double *in_stack_fffffffffffff8d0;
  double *in_stack_fffffffffffff8d8;
  double *in_stack_fffffffffffff8e0;
  double *in_stack_fffffffffffff8e8;
  double *in_stack_fffffffffffff8f0;
  double *in_stack_fffffffffffff8f8;
  double *in_stack_fffffffffffff900;
  double *in_stack_fffffffffffff908;
  double *in_stack_fffffffffffff910;
  double *in_stack_fffffffffffff918;
  double *in_stack_fffffffffffff920;
  int local_29c;
  double ****local_298;
  double ****local_290;
  double ***local_288;
  double ***local_280;
  double **local_278;
  double **local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  double *local_240;
  double *local_238;
  double *local_230;
  double *local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  xc_func_type *local_1d8;
  double *local_1d0;
  double *local_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  func_reference_type *local_1a8;
  double *local_1a0;
  double *local_198;
  xc_func_info_type *local_190;
  char **local_188;
  double *******local_180;
  xc_func_type ******local_178;
  double ******local_170;
  xc_func_type *****local_168;
  double *****local_160;
  xc_func_type ****local_158;
  double ****local_150;
  xc_func_type ***local_148;
  double ***local_140;
  char **local_138;
  double **local_130;
  xc_func_type **local_128;
  double *local_120;
  xc_func_type *local_118;
  func_reference_type ****local_110;
  undefined1 local_108 [8];
  func_reference_type ***local_100;
  xc_func_type **local_f8;
  func_reference_type **local_f0;
  xc_func_type *local_e8;
  func_reference_type *local_e0;
  func_reference_type *local_d8;
  undefined1 local_d0 [16];
  func_reference_type *local_c0;
  undefined1 local_b8 [8];
  func_reference_type local_b0;
  xc_func_type **local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  xc_lda_funcs_variants *local_70;
  long *local_68;
  long local_40;
  long local_38;
  
  for (local_29c = 0; local_29c < *(int *)(in_RDI + 0xc); local_29c = local_29c + 1) {
    local_68 = *(long **)(*(long *)(in_RDI + 0x10) + (long)local_29c * 8);
  }
  for (local_29c = 0; local_29c < *(int *)(in_RDI + 0xc); local_29c = local_29c + 1) {
    local_68 = *(long **)(*(long *)(in_RDI + 0x10) + (long)local_29c * 8);
  }
  for (local_29c = 0; local_29c < *(int *)(in_RDI + 0xc); local_29c = local_29c + 1) {
    local_68 = *(long **)(*(long *)(in_RDI + 0x10) + (long)local_29c * 8);
  }
  for (local_29c = 0; local_29c < *(int *)(in_RDI + 0xc); local_29c = local_29c + 1) {
    local_68 = *(long **)(*(long *)(in_RDI + 0x10) + (long)local_29c * 8);
  }
  local_298 = (double ****)0x0;
  local_290 = (double ****)0x0;
  local_288 = (double ***)0x0;
  local_280 = (double ***)0x0;
  local_278 = (double **)0x0;
  local_270 = (double **)0x0;
  local_268 = (double *)0x0;
  local_260 = (double *)0x0;
  local_258 = (double *)0x0;
  local_250 = (double *)0x0;
  local_248 = (double *)0x0;
  local_240 = (double *)0x0;
  local_238 = (double *)0x0;
  local_230 = (double *)0x0;
  local_228 = (double *)0x0;
  local_220 = (double *)0x0;
  local_218 = (double *)0x0;
  local_210 = (double *)0x0;
  local_208 = (double *)0x0;
  local_200 = (double *)0x0;
  local_1f8 = (double *)0x0;
  local_1f0 = (double *)0x0;
  local_1e8 = (double *)0x0;
  local_1e0 = (double *)0x0;
  local_1d8 = (xc_func_type *)0x0;
  local_1d0 = (double *)0x0;
  local_1c8 = (double *)0x0;
  local_1c0 = (double *)0x0;
  local_1b8 = (double *)0x0;
  local_1b0 = (double *)0x0;
  local_1a8 = (func_reference_type *)0x0;
  local_1a0 = (double *)0x0;
  local_198 = (double *)0x0;
  local_190 = (xc_func_info_type *)0x0;
  local_188 = (char **)0x0;
  local_180 = (double *******)0x0;
  local_178 = (xc_func_type ******)0x0;
  local_170 = (double ******)0x0;
  local_168 = (xc_func_type *****)0x0;
  local_160 = (double *****)0x0;
  local_158 = (xc_func_type ****)0x0;
  local_150 = (double ****)0x0;
  local_148 = (xc_func_type ***)0x0;
  local_140 = (double ***)0x0;
  local_138 = (char **)0x0;
  local_130 = (double **)0x0;
  local_128 = (xc_func_type **)0x0;
  local_120 = (double *)0x0;
  local_118 = (xc_func_type *)0x0;
  local_110 = (func_reference_type ****)0x0;
  local_108 = (undefined1  [8])0x0;
  local_100 = (func_reference_type ***)0x0;
  local_f8 = (xc_func_type **)0x0;
  local_f0 = (func_reference_type **)0x0;
  local_e8 = (xc_func_type *)0x0;
  local_e0 = (func_reference_type *)0x0;
  local_d8 = (func_reference_type *)0x0;
  local_d0._0_8_ = (double *)0x0;
  local_d0._8_8_ = (xc_func_type *)0x0;
  local_c0 = (func_reference_type *)0x0;
  local_b8 = (undefined1  [8])0x0;
  local_b0.ref = (char *)0x0;
  local_b0.doi = (char *)0x0;
  local_b0.bibtex = (char *)0x0;
  local_b0.key = (char *)0x0;
  local_90 = (xc_func_type **)0x0;
  local_88 = (double *)0x0;
  local_80 = (double *)0x0;
  local_78 = (double *)0x0;
  local_70 = (xc_lda_funcs_variants *)0x0;
  v2rho2_00 = (undefined1  [8])&local_90;
  zk_00 = &local_b0.key;
  vrho_00 = &local_b0.bibtex;
  vsigma_00 = (undefined1  [8])&local_b0.doi;
  vlapl_00 = &local_b0;
  p = (xc_func_type *)local_b8;
  v2rhosigma_00 = (func_reference_type *)(local_d0 + 8);
  v2rholapl_00 = (func_reference_type *)local_d0;
  v2sigma2_00 = &local_e0;
  v2sigmalapl_00 = &local_e8;
  v2sigmatau_00 = &local_f0;
  v2lapl2_00 = (undefined1  [8])&local_f8;
  v2lapltau_00 = &local_100;
  p_00 = (xc_func_type *)local_108;
  v3rho2sigma_00 = &local_118;
  v3rho2lapl_00 = &local_120;
  v3rho2tau_00 = (char **)&local_128;
  v3rhosigma2_00 = &local_130;
  v3rhosigmalapl_00 = (xc_func_type ***)&local_138;
  v3rhosigmatau_00 = &local_140;
  v3rholapl2_00 = &local_148;
  v3rholapltau_00 = &local_150;
  v3rhotau2_00 = &local_158;
  v3sigma3_00 = &local_160;
  v3sigma2lapl_00 = &local_168;
  v3sigma2tau_00 = &local_170;
  v3sigmalapl2_00 = (char **)&local_178;
  v4sigma3tau_00 = &local_260;
  v4sigma2lapl2_00 = &local_268;
  v4sigma2lapltau_00 = &local_270;
  v4sigma2tau2_00 = &local_278;
  v4sigmalapl3_00 = &local_280;
  v4sigmalapl2tau_00 = &local_288;
  v4sigmalapltau2_00 = &local_290;
  local_40 = in_RSI;
  local_38 = in_RDI;
  xc_mgga_vars_allocate_all
            ((int)((ulong)&local_78 >> 0x20),(size_t)&local_70,
             (xc_dimensions *)
             CONCAT44((int)((ulong)in_stack_fffffffffffff530 >> 0x20),(uint)(in_stack_00000120 != 0)
                     ),(int)((ulong)in_stack_fffffffffffff528 >> 0x20),
             (uint)(in_stack_00000080 != 0),0,(int)&local_88,SUB84(v2rho2_00,0),(double **)zk_00,
             (double **)vrho_00,(double **)vsigma_00,(double **)vlapl_00,(double **)p,
             (double **)&local_c0,(double **)v2rhosigma_00,(double **)v2rholapl_00,
             (double **)&local_d8,(double **)v2sigma2_00,(double **)v2sigmalapl_00,
             (double **)v2sigmatau_00,(double **)v2lapl2_00,(double **)v2lapltau_00,(double **)p_00,
             (double **)&local_110,(double **)v3rho2sigma_00,v3rho2lapl_00,(double **)v3rho2tau_00,
             (double **)v3rhosigma2_00,(double **)v3rhosigmalapl_00,(double **)v3rhosigmatau_00,
             (double **)v3rholapl2_00,(double **)v3rholapltau_00,(double **)v3rhotau2_00,
             (double **)v3sigma3_00,(double **)v3sigma2lapl_00,(double **)v3sigma2tau_00,
             (double **)v3sigmalapl2_00,(double **)&local_180,(double **)&local_188,
             (double **)&local_190,&local_198,&local_1a0,(double **)&local_1a8,&local_1b0,&local_1b8
             ,&local_1c0,&local_1c8,&local_1d0,(double **)&local_1d8,&local_1e0,&local_1e8,
             &local_1f0,&local_1f8,&local_200,&local_208,&local_210,&local_218,&local_220,&local_228
             ,&local_230,&local_238,&local_240,&local_248,&local_250,&local_258,v4sigma3tau_00,
             v4sigma2lapl2_00,(double **)v4sigma2lapltau_00,(double **)v4sigma2tau2_00,
             (double **)v4sigmalapl3_00,(double **)v4sigmalapl2tau_00,(double **)v4sigmalapltau2_00,
             (double **)&local_298,in_stack_fffffffffffff768,in_stack_fffffffffffff770,
             in_stack_fffffffffffff778,in_stack_fffffffffffff780,in_stack_fffffffffffff788);
  local_29c = 0;
  do {
    if (*(int *)(local_38 + 0xc) <= local_29c) {
      xc_mgga_vars_free_all
                ((double *)local_d0._8_8_,(double *)local_c0,(double *)local_b8,
                 (double *)local_b0.ref,(double *)local_b0.doi,(double *)local_b0.bibtex,
                 (double *)local_d8,(double *)local_e0,(double *)local_e8,(double *)local_f0,
                 (double *)local_f8,(double *)local_100,(double *)local_108,(double *)local_110,
                 (double *)local_118,local_120,(double *)local_128,(double *)local_130,
                 (double *)local_138,(double *)local_140,(double *)local_148,(double *)local_150,
                 (double *)local_158,(double *)local_160,(double *)local_168,(double *)local_170,
                 (double *)local_178,(double *)local_180,(double *)local_188,(double *)local_190,
                 local_198,local_1a0,(double *)local_1a8,local_1b0,local_1b8,local_1c0,local_1c8,
                 local_1d0,(double *)local_1d8,local_1e0,local_1e8,local_1f0,local_1f8,local_200,
                 local_208,local_210,local_218,local_220,local_228,local_230,local_238,local_240,
                 local_248,local_250,local_258,local_260,local_268,(double *)local_270,
                 (double *)local_278,(double *)local_280,(double *)local_288,(double *)local_290,
                 (double *)local_298,(double *)v4sigma3tau_00,(double *)v4sigma2lapl2_00,
                 (double *)v4sigma2lapltau_00,(double *)v4sigma2tau2_00,(double *)v4sigmalapl3_00,
                 (double *)v4sigmalapl2tau_00,(double *)v4sigmalapltau2_00);
      return;
    }
    local_68 = *(long **)(*(long *)(local_38 + 0x10) + (long)local_29c * 8);
    iVar1 = *(int *)(*local_68 + 0x10);
    if (iVar1 == 1) {
LAB_01ae212d:
      xc_lda(p,(size_t)vlapl_00,(double *)vsigma_00,(double *)vrho_00,(double *)zk_00,
             (double *)v2rho2_00,(double *)v2rhosigma_00,(double *)v2rholapl_00);
    }
    else if (iVar1 == 2) {
LAB_01ae2180:
      v2rho2_00 = local_108;
      zk_00 = local_138;
      vrho_00 = local_188;
      vsigma_00 = (undefined1  [8])local_190;
      vlapl_00 = local_1a8;
      p = local_1d8;
      xc_gga(p_00,(size_t)v2lapltau_00,(double *)v2lapl2_00,(double *)v2sigmatau_00,
             (double *)v2sigmalapl_00,(double *)v2sigma2_00,(double *)v3rho2sigma_00,
             (double *)v3rho2lapl_00,(double *)v3rho2tau_00,(double *)v3rhosigma2_00,
             (double *)v3rhosigmalapl_00,(double *)v3rhosigmatau_00,(double *)v3rholapl2_00,
             (double *)v3rholapltau_00,(double *)v3rhotau2_00,(double *)v3sigma3_00,
             (double *)v3sigma2lapl_00,(double *)v3sigma2tau_00,(double *)v3sigmalapl2_00);
    }
    else {
      if (iVar1 != 4) {
        if (iVar1 == 0x20) goto LAB_01ae2180;
        if (iVar1 != 0x40) {
          if (iVar1 == 0x80) goto LAB_01ae212d;
          goto LAB_01ae2af6;
        }
      }
      v2rho2_00 = (undefined1  [8])local_b0.bibtex;
      zk_00 = (char **)local_b0.doi;
      vrho_00 = (char **)local_b0.ref;
      vsigma_00 = local_b8;
      vlapl_00 = local_c0;
      p = (xc_func_type *)local_d0._8_8_;
      v2rhosigma_00 = local_d8;
      v2rholapl_00 = local_e0;
      v2sigma2_00 = local_f0;
      v2sigmalapl_00 = local_f8;
      v2sigmatau_00 = local_100;
      v2lapl2_00 = local_108;
      v2lapltau_00 = local_110;
      p_00 = local_118;
      v3rho2sigma_00 = local_128;
      v3rho2lapl_00 = local_130;
      v3rho2tau_00 = local_138;
      v3rhosigma2_00 = local_140;
      v3rhosigmalapl_00 = local_148;
      v3rhosigmatau_00 = local_150;
      v3rholapl2_00 = local_158;
      v3rholapltau_00 = local_160;
      v3rhotau2_00 = local_168;
      v3sigma3_00 = local_170;
      v3sigma2lapl_00 = local_178;
      v3sigma2tau_00 = local_180;
      v3sigmalapl2_00 = local_188;
      v4sigma3tau_00 = local_270;
      v4sigma2lapl2_00 = local_278;
      v4sigma2lapltau_00 = local_280;
      v4sigma2tau2_00 = local_288;
      v4sigmalapl3_00 = local_290;
      v4sigmalapl2tau_00 = local_298;
      xc_mgga(in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
              (double *)in_stack_fffffffffffff780,(double *)in_stack_fffffffffffff778,
              (double *)in_stack_fffffffffffff770,(double *)in_stack_fffffffffffff768,
              in_stack_fffffffffffff7a0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7b0,
              in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,
              in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0,
              in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8,
              in_stack_fffffffffffff800,in_stack_fffffffffffff808,in_stack_fffffffffffff810,
              in_stack_fffffffffffff818,in_stack_fffffffffffff820,in_stack_fffffffffffff828,
              in_stack_fffffffffffff830,in_stack_fffffffffffff838,in_stack_fffffffffffff840,
              in_stack_fffffffffffff848,in_stack_fffffffffffff850,in_stack_fffffffffffff858,
              in_stack_fffffffffffff860,in_stack_fffffffffffff868,in_stack_fffffffffffff870,
              in_stack_fffffffffffff878,in_stack_fffffffffffff880,in_stack_fffffffffffff888,
              in_stack_fffffffffffff890,in_stack_fffffffffffff898,in_stack_fffffffffffff8a0,
              in_stack_fffffffffffff8a8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8b8,
              in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8d0,
              in_stack_fffffffffffff8d8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,
              in_stack_fffffffffffff8f0,in_stack_fffffffffffff8f8,in_stack_fffffffffffff900,
              in_stack_fffffffffffff908,in_stack_fffffffffffff910,in_stack_fffffffffffff918,
              in_stack_fffffffffffff920,(double *)local_70,local_78,local_80,local_88,
              (double *)local_90,(double *)local_b0.key,(double *)local_b0.bibtex,
              (double *)local_b0.doi,(double *)local_b0.ref,(double *)local_b8,(double *)local_c0,
              (double *)local_d0._8_8_,(double *)local_d0._0_8_,(double *)local_d8,
              (double *)local_e0,(double *)local_e8,(double *)local_f0,(double *)local_f8,
              (double *)local_100,(double *)local_108,(double *)local_110);
    }
LAB_01ae2af6:
    if (in_stack_00000008 != (double *)0x0) {
      add_to_mix(local_40 * *(int *)(in_RDI + 0x58),in_stack_00000008,
                 *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),(double *)local_70);
    }
    if (in_stack_00000010 != (double *)0x0) {
      add_to_mix(local_40 * *(int *)(in_RDI + 0x5c),in_stack_00000010,
                 *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),local_78);
      if ((((*(int *)(*local_68 + 0x10) == 2) || (*(int *)(*local_68 + 0x10) == 0x20)) ||
          (*(int *)(*local_68 + 0x10) == 4)) || (*(int *)(*local_68 + 0x10) == 0x40)) {
        add_to_mix(local_40 * *(int *)(in_RDI + 0x60),in_stack_00000018,
                   *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),local_80);
      }
      if ((*(int *)(*local_68 + 0x10) == 4) || (*(int *)(*local_68 + 0x10) == 0x40)) {
        if ((*(uint *)(*local_68 + 0x40) & 0x8000) != 0) {
          add_to_mix(local_40 * *(int *)(in_RDI + 100),in_stack_00000020,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),local_88);
        }
        if ((*(uint *)(*local_68 + 0x40) & 0x10000) != 0) {
          add_to_mix(local_40 * *(int *)(in_RDI + 0x68),in_stack_00000028,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_90);
        }
      }
    }
    if (in_stack_00000030 != (double *)0x0) {
      add_to_mix(local_40 * *(int *)(in_RDI + 0x6c),in_stack_00000030,
                 *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                 (double *)local_b0.key);
      if (((*(int *)(*local_68 + 0x10) == 2) || (*(int *)(*local_68 + 0x10) == 0x20)) ||
         ((*(int *)(*local_68 + 0x10) == 4 || (*(int *)(*local_68 + 0x10) == 0x40)))) {
        add_to_mix(local_40 * *(int *)(in_RDI + 0x70),in_stack_00000038,
                   *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                   (double *)local_b0.bibtex);
        add_to_mix(local_40 * *(int *)(in_RDI + 0x7c),in_stack_00000050,
                   *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),(double *)local_b8)
        ;
      }
      if ((*(int *)(*local_68 + 0x10) == 4) || (*(int *)(*local_68 + 0x10) == 0x40)) {
        if ((*(uint *)(*local_68 + 0x40) & 0x8000) != 0) {
          add_to_mix(local_40 * *(int *)(in_RDI + 0x74),in_stack_00000040,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_b0.doi);
          add_to_mix(local_40 * *(int *)(in_RDI + 0x80),in_stack_00000058,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_c0);
          add_to_mix(local_40 * *(int *)(in_RDI + 0x88),in_stack_00000068,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_d0._0_8_);
        }
        if ((*(uint *)(*local_68 + 0x40) & 0x10000) != 0) {
          add_to_mix(local_40 * *(int *)(in_RDI + 0x78),in_stack_00000048,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_b0.ref);
          add_to_mix(local_40 * *(int *)(in_RDI + 0x84),in_stack_00000060,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_d0._8_8_);
          add_to_mix(local_40 * *(int *)(in_RDI + 0x90),in_stack_00000078,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_e0);
        }
        if (((*(uint *)(*local_68 + 0x40) & 0x8000) != 0) &&
           ((*(uint *)(*local_68 + 0x40) & 0x10000) != 0)) {
          add_to_mix(local_40 * *(int *)(in_RDI + 0x8c),in_stack_00000070,
                     *(double *)(*(long *)(local_38 + 0x18) + (long)local_29c * 8),
                     (double *)local_d8);
        }
      }
    }
    local_29c = local_29c + 1;
  } while( true );
}

Assistant:

void
xc_mix_func(const xc_func_type *func, size_t np,
            const double *rho, const double *sigma, const double *lapl, const double *tau,
            double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  const xc_func_type *aux;
  double *xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, x);
  int ii;

  const xc_dimensions *dim = &(func->dim);

  /* Sanity check: have we claimed the highest possible derivatives?
     First, check for the lowest common derivative (also need to make
     sure the derivatives have been compiled in!)
  */
  int have_vxc = XC_FLAGS_I_HAVE_VXC;
  int have_fxc = XC_FLAGS_I_HAVE_FXC;
  int have_kxc = XC_FLAGS_I_HAVE_KXC;
  int have_lxc = XC_FLAGS_I_HAVE_LXC;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(! (aux->info->flags & XC_FLAGS_HAVE_VXC))
      have_vxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_FXC))
      have_fxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_KXC))
      have_kxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_LXC))
      have_lxc = 0;
  }
  /* Then, for the actual checks */
  assert(have_lxc == (func->info->flags & XC_FLAGS_I_HAVE_LXC));
  assert(have_kxc == (func->info->flags & XC_FLAGS_I_HAVE_KXC));
  assert(have_fxc == (func->info->flags & XC_FLAGS_I_HAVE_FXC));
  assert(have_vxc == (func->info->flags & XC_FLAGS_I_HAVE_VXC));

  /* Sanity check: if component needs the Laplacian, then the mix
     must require it too */
  int need_laplacian = 0;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
      need_laplacian = XC_FLAGS_NEEDS_LAPLACIAN;
  }
  assert((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) == need_laplacian);
  /* Same for tau */
  int need_tau = 0;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(aux->info->flags & XC_FLAGS_NEEDS_TAU)
      need_tau = XC_FLAGS_NEEDS_TAU;
  }
  assert((func->info->flags & XC_FLAGS_NEEDS_TAU) == need_tau);

  /* Check compatibility of the individual components */
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    /* Sanity check: if component is GGA or meta-GGA, mix functional
       must also be GGA or meta-GGA */
    if(is_gga(aux->info->family))
      assert(is_gga(func->info->family));
    if(is_mgga(aux->info->family) && !is_mgga(func->info->family))
      assert(is_mgga(func->info->family));
    /* Sanity checks: if mix functional has higher derivatives, these
       must also exist in the individual components */
    if(func->info->flags & XC_FLAGS_HAVE_VXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_VXC);
    if(func->info->flags & XC_FLAGS_HAVE_FXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_FXC);
    if(func->info->flags & XC_FLAGS_HAVE_KXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_KXC);
    if(func->info->flags & XC_FLAGS_HAVE_LXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_LXC);
  }

  /* prepare buffers that will hold the results from the individual functionals */
  xzk MGGA_OUT_PARAMS_NO_EXC(=, x) = NULL;

  /* allocate buffers */
  xc_mgga_vars_allocate_all(func->info->family, np, dim,
                            zk != NULL, vrho != NULL, v2rho2 != NULL, v3rho3 != NULL, v4rho4 != NULL,
                            &xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, x));

  /* Proceed by computing the mix */
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];

    /* Evaluate the functional */
    switch(aux->info->family){
    case XC_FAMILY_LDA:
    case XC_FAMILY_HYB_LDA:
      xc_lda(aux, np, rho,
             xzk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    case XC_FAMILY_GGA:
    case XC_FAMILY_HYB_GGA:
      xc_gga(aux, np, rho, sigma,
             xzk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    case XC_FAMILY_MGGA:
    case XC_FAMILY_HYB_MGGA:
      xc_mgga(aux, np, rho, sigma, lapl, tau,
              xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    }

    /* Do the mixing */
    if(zk != NULL) {
      sum_var(zk);
    }

 #ifndef XC_DONT_COMPILE_VXC
    if(vrho != NULL) {
      sum_var(vrho);

      if(is_gga(aux->info->family)) {
        sum_var(vsigma);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(vlapl);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(vtau);
        }
      }
    }

#ifndef XC_DONT_COMPILE_FXC
    if(v2rho2 != NULL){
      sum_var(v2rho2);

      if(is_gga(aux->info->family)) {
        sum_var(v2rhosigma);
        sum_var(v2sigma2);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v2rholapl);
          sum_var(v2sigmalapl);
          sum_var(v2lapl2);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v2rhotau);
          sum_var(v2sigmatau);
          sum_var(v2tau2);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v2lapltau);
        }
      }
    }

#ifndef XC_DONT_COMPILE_KXC
    if(v3rho3 != NULL){
      sum_var(v3rho3);

      if(is_gga(aux->info->family)) {
        sum_var(v3rho2sigma);
        sum_var(v3rhosigma2);
        sum_var(v3sigma3);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v3rho2lapl);
          sum_var(v3rhosigmalapl);
          sum_var(v3rholapl2);
          sum_var(v3sigma2lapl);
          sum_var(v3sigmalapl2);
          sum_var(v3lapl3);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v3rho2tau);
          sum_var(v3rhosigmatau);
          sum_var(v3rhotau2);
          sum_var(v3sigma2tau);
          sum_var(v3sigmatau2);
          sum_var(v3tau3);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v3rholapltau);
          sum_var(v3sigmalapltau);
          sum_var(v3lapl2tau);
          sum_var(v3lapltau2);
        }
      }
    }

#ifndef XC_DONT_COMPILE_LXC
    if(v4rho4 != NULL){
      sum_var(v4rho4);

      if(is_gga(aux->info->family)) {
        sum_var(v4rho3sigma);
        sum_var(v4rho2sigma2);
        sum_var(v4rhosigma3);
        sum_var(v4sigma4);
      }
      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v4rho3lapl);
          sum_var(v4rho2sigmalapl);
          sum_var(v4rho2lapl2);
          sum_var(v4rhosigma2lapl);
          sum_var(v4rhosigmalapl2);
          sum_var(v4rholapl3);
          sum_var(v4sigma3lapl);
          sum_var(v4sigma2lapl2);
          sum_var(v4sigmalapl3);
          sum_var(v4lapl4);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v4rho3tau);
          sum_var(v4rho2sigmatau);
          sum_var(v4rho2tau2);
          sum_var(v4rhosigma2tau);
          sum_var(v4rhosigmatau2);
          sum_var(v4rhotau3);
          sum_var(v4sigma3tau);
          sum_var(v4sigma2tau2);
          sum_var(v4sigmatau3);
          sum_var(v4tau4);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v4rho2lapltau);
          sum_var(v4rhosigmalapltau);
          sum_var(v4rholapl2tau);
          sum_var(v4rholapltau2);
          sum_var(v4sigma2lapltau);
          sum_var(v4sigmalapl2tau);
          sum_var(v4sigmalapltau2);
          sum_var(v4lapl3tau);
          sum_var(v4lapl2tau2);
          sum_var(v4lapltau3);
        }
      }
    }
#endif
#endif
#endif
#endif
  } /* end functional loop */

  /* deallocate internal buffers */
  xc_mgga_vars_free_all(xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
}